

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsVertexArrayTests.cpp
# Opt level: O2

void __thiscall
deqp::gls::ContextArray::subdata(ContextArray *this,Target target,int offset,int size,char *ptr)

{
  uint uVar1;
  deUint32 dVar2;
  
  this->m_target = target;
  if (this->m_storage == STORAGE_USER) {
    memcpy(this->m_data + offset,ptr,(long)size);
    return;
  }
  if (this->m_storage == STORAGE_BUFFER) {
    uVar1 = targetToGL::targets[(int)target];
    (*this->m_ctx->_vptr_Context[0x25])(this->m_ctx,(ulong)uVar1,(ulong)this->m_glBuffer);
    dVar2 = (*this->m_ctx->_vptr_Context[0x79])();
    glu::checkError(dVar2,"glBindBuffer()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsVertexArrayTests.cpp"
                    ,0x209);
    (*this->m_ctx->_vptr_Context[0x29])(this->m_ctx,(ulong)uVar1,(long)offset,(long)size,ptr);
    dVar2 = (*this->m_ctx->_vptr_Context[0x79])();
    glu::checkError(dVar2,"glBufferSubData()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsVertexArrayTests.cpp"
                    ,0x20c);
    return;
  }
  return;
}

Assistant:

void ContextArray::subdata (Target target, int offset, int size, const char* ptr)
{
	m_target = target;

	if (m_storage == STORAGE_BUFFER)
	{
		m_ctx.bindBuffer(targetToGL(target), m_glBuffer);
		GLU_EXPECT_NO_ERROR(m_ctx.getError(), "glBindBuffer()");

		m_ctx.bufferSubData(targetToGL(target), offset, size, ptr);
		GLU_EXPECT_NO_ERROR(m_ctx.getError(), "glBufferSubData()");
	}
	else if (m_storage == STORAGE_USER)
		std::memcpy(m_data + offset, ptr, size);
	else
		DE_ASSERT(false);
}